

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfArray.h
# Opt level: O2

void __thiscall
Imf_3_4::Array2D<Imf_3_4::Array2D<Imath_3_2::half>_>::Array2D
          (Array2D<Imf_3_4::Array2D<Imath_3_2::half>_> *this,long sizeX,long sizeY)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong *puVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = sizeY * sizeX;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar5;
  uVar2 = SUB168(auVar1 * ZEXT816(0x18),0);
  uVar4 = uVar2 + 8;
  if (0xfffffffffffffff7 < uVar2) {
    uVar4 = 0xffffffffffffffff;
  }
  this->_sizeX = sizeX;
  this->_sizeY = sizeY;
  if (SUB168(auVar1 * ZEXT816(0x18),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  puVar3 = (ulong *)operator_new__(uVar4);
  *puVar3 = uVar5;
  if (uVar5 != 0) {
    memset((Array2D<Imath_3_2::half> *)(puVar3 + 1),0,
           ((uVar2 - 0x18) - (uVar2 - 0x18) % 0x18) + 0x18);
  }
  this->_data = (Array2D<Imath_3_2::half> *)(puVar3 + 1);
  return;
}

Assistant:

inline Array2D<T>::Array2D (long sizeX, long sizeY)
    : _sizeX (sizeX), _sizeY (sizeY), _data (new T[sizeX * sizeY])
{
    // empty
}